

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O1

int flyd::flyd_daemon(void)

{
  __pid_t _Var1;
  int iVar2;
  int iVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  Logger LStack_fe8;
  
  umask(0);
  _Var1 = fork();
  if (_Var1 == 0) {
    if (muduo::g_logLevel < 3) {
      file_00._8_8_ = 0xf;
      file_00.data_ = "flyd_process.cc";
      muduo::Logger::Logger(&LStack_fe8,file_00,0x2b);
      if (0x18 < (uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,"THIS IS MASTER PROCESS\n ",0x18);
        LStack_fe8.impl_.stream_.buffer_.cur_ = LStack_fe8.impl_.stream_.buffer_.cur_ + 0x18;
      }
      muduo::Logger::~Logger(&LStack_fe8);
    }
    prctl(0xf,mater_name);
    flyd_process = FLYD_MASTER_PROCESS;
    _Var1 = setsid();
    if (_Var1 == -1) {
      file_02._8_8_ = 0xf;
      file_02.data_ = "flyd_process.cc";
      muduo::Logger::Logger(&LStack_fe8,file_02,0x39,ERROR);
      if (0x20 < (uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,"flyd_daemon()中setsid()失败!\n",
                        0x20);
        LStack_fe8.impl_.stream_.buffer_.cur_ = LStack_fe8.impl_.stream_.buffer_.cur_ + 0x20;
      }
      goto LAB_00111f5d;
    }
    iVar2 = open("/dev/null",2);
    if (iVar2 == -1) {
      file_03._8_8_ = 0xf;
      file_03.data_ = "flyd_process.cc";
      muduo::Logger::Logger(&LStack_fe8,file_03,0x4c,ERROR);
      if (0x28 < (uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,
                        "ngx_daemon()中open(\"/dev/null\")失败!\n",0x28);
        LStack_fe8.impl_.stream_.buffer_.cur_ = LStack_fe8.impl_.stream_.buffer_.cur_ + 0x28;
      }
      goto LAB_00111f5d;
    }
    iVar3 = dup2(iVar2,0);
    if (iVar3 == -1) {
      file_04._8_8_ = 0xf;
      file_04.data_ = "flyd_process.cc";
      muduo::Logger::Logger(&LStack_fe8,file_04,0x51,ERROR);
      if (0x22 < (uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_)) {
        builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,"ngx_daemon()中dup2(STDIN)失败!\n",
                        0x22);
        LStack_fe8.impl_.stream_.buffer_.cur_ = LStack_fe8.impl_.stream_.buffer_.cur_ + 0x22;
      }
      goto LAB_00111f5d;
    }
    iVar2 = dup2(iVar2,1);
    if (iVar2 != -1) {
      return 0;
    }
    file_01._8_8_ = 0xf;
    file_01.data_ = "flyd_process.cc";
    muduo::Logger::Logger(&LStack_fe8,file_01,0x56,ERROR);
    if ((uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_) < 0x24)
    goto LAB_00111f5d;
    builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,"ngx_daemon()中dup2(STDOUT)失败!\n",
                    0x23);
  }
  else {
    if (_Var1 != -1) {
      return 1;
    }
    file._8_8_ = 0xf;
    file.data_ = "flyd_process.cc";
    muduo::Logger::Logger(&LStack_fe8,file,0x27,FATAL);
    if ((uint)(((int)&LStack_fe8 + 0xfb8) - (int)LStack_fe8.impl_.stream_.buffer_.cur_) < 0x24)
    goto LAB_00111f5d;
    builtin_strncpy(LStack_fe8.impl_.stream_.buffer_.cur_,"创建master子进程失败,退出\n",
                    0x23);
  }
  LStack_fe8.impl_.stream_.buffer_.cur_ = LStack_fe8.impl_.stream_.buffer_.cur_ + 0x23;
LAB_00111f5d:
  muduo::Logger::~Logger(&LStack_fe8);
  return -1;
}

Assistant:

int flyd_daemon() {

        //1.给予守护进程最高文件权限
        umask(0);

        //2.fork子进程作为守护进程
        int flag;
        flag = fork();
        switch (flag)  //fork()出来这个子进程才会成为咱们这里讲解的master进程；
        {
            case -1:
                //创建子进程失败
                LOG_FATAL << "创建master子进程失败,退出\n";
                return -1;
            case 0:
                //master子进程，走到这里直接break;
                LOG_INFO << "THIS IS MASTER PROCESS\n ";
                prctl(PR_SET_NAME, mater_name);
                flyd_process = FLYD_MASTER_PROCESS;
                break;
            default:
                //父进程以往 直接退出exit(0);现在希望回到主流程去释放一些资源
                return 1;  //父进程直接返回1；
                // exit(0);
        } //end switch


        //以下都是master子进程的程序空间了
        //3.调用setsid设置新的会话
        if (setsid() == -1) {
            LOG_ERROR<<"flyd_daemon()中setsid()失败!\n";
            return -1;
        }

        //4.更改文件目录为根文件目录
        //5.关闭用不到的文件描述符
        int i = 0;
        if (i > STDERR_FILENO)  //fd应该是3，这个应该成立
        {
            if (close(i) == -1)  //释放资源这样这个文件描述符就可以被复用；不然这个数字【文件描述符】会被一直占着；
            {
                LOG_ERROR << "ngx_daemon()中close(fd)失败!\n";
                return -1;
            }
        }

        //6.重定向标准输入输出
        int fd = open("/dev/null", O_RDWR);
        if (fd == -1) {
            LOG_ERROR << "ngx_daemon()中open(\"/dev/null\")失败!\n";
            return -1;
        }
        if (dup2(fd, STDIN_FILENO) == -1) //先关闭STDIN_FILENO[这是规矩，已经打开的描述符，动他之前，先close]，类似于指针指向null，让/dev/null成为标准输入；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDIN)失败!\n";
            return -1;
        }
        if (dup2(fd, STDOUT_FILENO) == -1) //再关闭STDIN_FILENO，类似于指针指向null，让/dev/null成为标准输出；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDOUT)失败!\n";
            return -1;
        }

        return 0;  //子进程返回
    }